

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_gates.cpp
# Opt level: O0

void lsim::sim_register_gate_functions(Simulator *sim)

{
  Simulator *pSVar1;
  anon_class_1_0_00000001 local_181;
  simulation_func_t local_180;
  anon_class_1_0_00000001 local_159;
  simulation_func_t local_158;
  anon_class_1_0_00000001 local_131;
  simulation_func_t local_130;
  anon_class_1_0_00000001 local_109;
  simulation_func_t local_108;
  anon_class_1_0_00000001 local_e1;
  simulation_func_t local_e0;
  anon_class_1_0_00000001 local_b9;
  simulation_func_t local_b8;
  anon_class_1_0_00000001 local_91;
  simulation_func_t local_90;
  anon_class_1_0_00000001 local_69;
  simulation_func_t local_68;
  anon_class_1_0_00000001 local_31;
  simulation_func_t local_30;
  Simulator *local_10;
  Simulator *sim_local;
  
  local_10 = sim;
  std::function<void(lsim::Simulator*,lsim::SimComponent*)>::
  function<lsim::sim_register_gate_functions(lsim::Simulator*)::__0,void>
            ((function<void(lsim::Simulator*,lsim::SimComponent*)> *)&local_30,&local_31);
  Simulator::register_sim_function(sim,0x11,1,&local_30);
  std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>::~function(&local_30);
  pSVar1 = local_10;
  std::function<void(lsim::Simulator*,lsim::SimComponent*)>::
  function<lsim::sim_register_gate_functions(lsim::Simulator*)::__1,void>
            ((function<void(lsim::Simulator*,lsim::SimComponent*)> *)&local_68,&local_69);
  Simulator::register_sim_function(pSVar1,0x12,1,&local_68);
  std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>::~function(&local_68);
  pSVar1 = local_10;
  std::function<void(lsim::Simulator*,lsim::SimComponent*)>::
  function<lsim::sim_register_gate_functions(lsim::Simulator*)::__2,void>
            ((function<void(lsim::Simulator*,lsim::SimComponent*)> *)&local_90,&local_91);
  Simulator::register_sim_function(pSVar1,0x13,1,&local_90);
  std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>::~function(&local_90);
  pSVar1 = local_10;
  std::function<void(lsim::Simulator*,lsim::SimComponent*)>::
  function<lsim::sim_register_gate_functions(lsim::Simulator*)::__3,void>
            ((function<void(lsim::Simulator*,lsim::SimComponent*)> *)&local_b8,&local_b9);
  Simulator::register_sim_function(pSVar1,0x14,1,&local_b8);
  std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>::~function(&local_b8);
  pSVar1 = local_10;
  std::function<void(lsim::Simulator*,lsim::SimComponent*)>::
  function<lsim::sim_register_gate_functions(lsim::Simulator*)::__4,void>
            ((function<void(lsim::Simulator*,lsim::SimComponent*)> *)&local_e0,&local_e1);
  Simulator::register_sim_function(pSVar1,0x15,1,&local_e0);
  std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>::~function(&local_e0);
  pSVar1 = local_10;
  std::function<void(lsim::Simulator*,lsim::SimComponent*)>::
  function<lsim::sim_register_gate_functions(lsim::Simulator*)::__5,void>
            ((function<void(lsim::Simulator*,lsim::SimComponent*)> *)&local_108,&local_109);
  Simulator::register_sim_function(pSVar1,0x16,1,&local_108);
  std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>::~function(&local_108);
  pSVar1 = local_10;
  std::function<void(lsim::Simulator*,lsim::SimComponent*)>::
  function<lsim::sim_register_gate_functions(lsim::Simulator*)::__6,void>
            ((function<void(lsim::Simulator*,lsim::SimComponent*)> *)&local_130,&local_131);
  Simulator::register_sim_function(pSVar1,0x17,1,&local_130);
  std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>::~function(&local_130);
  pSVar1 = local_10;
  std::function<void(lsim::Simulator*,lsim::SimComponent*)>::
  function<lsim::sim_register_gate_functions(lsim::Simulator*)::__7,void>
            ((function<void(lsim::Simulator*,lsim::SimComponent*)> *)&local_158,&local_159);
  Simulator::register_sim_function(pSVar1,0x18,1,&local_158);
  std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>::~function(&local_158);
  pSVar1 = local_10;
  std::function<void(lsim::Simulator*,lsim::SimComponent*)>::
  function<lsim::sim_register_gate_functions(lsim::Simulator*)::__8,void>
            ((function<void(lsim::Simulator*,lsim::SimComponent*)> *)&local_180,&local_181);
  Simulator::register_sim_function(pSVar1,0x19,1,&local_180);
  std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>::~function(&local_180);
  return;
}

Assistant:

void sim_register_gate_functions(Simulator *sim) {

    SIM_INPUT_CHANGED_FUNC_BEGIN(BUFFER) {
        for (auto pin = 0u; pin < comp->num_inputs(); ++pin) {
            auto value = comp->read_pin(comp->input_pin_index(pin));
            comp->write_pin(comp->output_pin_index(pin), value);
        }
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(TRISTATE_BUFFER) {
         if (comp->read_pin(comp->control_pin_index(0)) != VALUE_TRUE) {
            for (auto pin = 0u; pin < comp->num_outputs(); ++pin) {
                comp->write_pin(comp->output_pin_index(pin), VALUE_UNDEFINED);
            }
        } else {
            for (auto pin = 0u; pin < comp->num_inputs(); ++pin) {
                auto value = comp->read_pin(comp->input_pin_index(pin));
                comp->write_pin(comp->output_pin_index(pin), value);
            }
        }
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(AND_GATE) {
        comp->reset_bad_read_check();

        bool output = comp->read_pin_checked(0);
        for (auto idx = 1u; idx < comp->num_inputs(); ++idx) {
            output &= comp->read_pin_checked(idx);
        }
        comp->write_pin_checked(comp->output_pin_index(0), output);
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(OR_GATE) {
        comp->reset_bad_read_check();

        bool output = comp->read_pin_checked(0);
        for (auto idx = 1u; idx < comp->num_inputs(); ++idx) {
            output |= comp->read_pin_checked(idx);
        }
        comp->write_pin_checked(comp->output_pin_index(0), output);
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(NOT_GATE) {
        comp->reset_bad_read_check();
        auto input = comp->read_pin_checked(0);
        comp->write_pin_checked(1, !input);
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(NAND_GATE) {
        comp->reset_bad_read_check();

        bool output = comp->read_pin_checked(0);
        for (auto idx = 1u; idx < comp->num_inputs(); ++idx) {
            output &= comp->read_pin_checked(idx);
        }
        comp->write_pin_checked(comp->output_pin_index(0), !output);
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(NOR_GATE) {
        comp->reset_bad_read_check();

        bool output = comp->read_pin_checked(0);
        for (auto idx = 1u; idx < comp->num_inputs(); ++idx) {
            output |= comp->read_pin_checked(idx);
        }
        comp->write_pin_checked(comp->output_pin_index(0), !output);
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(XOR_GATE) {
        comp->reset_bad_read_check();

        auto output = comp->read_pin_checked(0);
        output ^= static_cast<int>(comp->read_pin_checked(1));
        comp->write_pin_checked(2, output);
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(XNOR_GATE) {
        comp->reset_bad_read_check();

        auto output = comp->read_pin_checked(0);
        output ^= static_cast<int>(comp->read_pin_checked(1));
        comp->write_pin_checked(2, !output);
    } SIM_FUNC_END
}